

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O0

void update_sample(qsound_chip *chip)

{
  UINT16 UVar1;
  qsound_chip *chip_local;
  
  UVar1 = chip->state;
  if (UVar1 == 0x39) {
    state_refresh_filter_1(chip);
  }
  else if (UVar1 == 0x4f) {
    state_refresh_filter_2(chip);
  }
  else if ((UVar1 == 0x288) || ((UVar1 != 0x314 && ((UVar1 == 0x61a || (UVar1 != 0x6b2)))))) {
    state_init(chip);
  }
  else {
    state_normal_update(chip);
  }
  return;
}

Assistant:

static void update_sample(struct qsound_chip *chip)
{
	switch(chip->state)
	{
		default:
		case STATE_INIT1:
		case STATE_INIT2:
			state_init(chip);
			return;
		case STATE_REFRESH1:
			state_refresh_filter_1(chip);
			return;
		case STATE_REFRESH2:
			state_refresh_filter_2(chip);
			return;
		case STATE_NORMAL1:
		case STATE_NORMAL2:
			state_normal_update(chip);
			return;
	}
}